

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp_decoder_ps.c
# Opt level: O2

void bp_update_ps(mod2sparse *H,char *synd,double *log_prob_ratios,int iter,char *decoding)

{
  uint uVar1;
  ulong uVar2;
  mod2entry *pmVar3;
  ulong uVar4;
  mod2entry *pmVar5;
  ulong uVar6;
  double in_XMM3_Qa;
  double dVar7;
  double dVar8;
  
  uVar4 = 0;
  uVar2 = (ulong)(uint)H->n_rows;
  if (H->n_rows < 1) {
    uVar2 = uVar4;
  }
  uVar1 = H->n_cols;
  for (; uVar4 != uVar2; uVar4 = uVar4 + 1) {
    dVar8 = 1.0;
    if (synd[uVar4] != '\0') {
      dVar8 = in_XMM3_Qa;
    }
    dVar7 = -1.0;
    if (synd[uVar4] != '\x01') {
      dVar7 = dVar8;
    }
    pmVar5 = H->rows;
    pmVar3 = pmVar5 + uVar4;
    while (pmVar3 = pmVar3->right, -1 < pmVar3->row) {
      pmVar3->lr = dVar7;
      dVar7 = dVar7 * (2.0 / (pmVar3->pr + 1.0) + -1.0);
    }
    pmVar5 = pmVar5 + uVar4;
    in_XMM3_Qa = 1.0;
    while (pmVar5 = pmVar5->left, -1 < pmVar5->row) {
      dVar8 = pmVar5->lr * in_XMM3_Qa;
      pmVar5->lr = (1.0 - dVar8) / (dVar8 + 1.0);
      in_XMM3_Qa = in_XMM3_Qa * (2.0 / (pmVar5->pr + 1.0) + -1.0);
    }
  }
  uVar4 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar4;
  }
  for (; uVar4 != uVar2; uVar4 = uVar4 + 1) {
    pmVar3 = H->cols + uVar4;
    dVar8 = prob_ratio_intial;
    while (pmVar3 = pmVar3->down, -1 < pmVar3->row) {
      pmVar3->pr = dVar8;
      dVar8 = dVar8 * pmVar3->lr;
    }
    dVar8 = (double)(~-(ulong)NAN(dVar8) & (ulong)dVar8 | -(ulong)NAN(dVar8) & 0x3ff0000000000000);
    dVar7 = log(1.0 / dVar8);
    log_prob_ratios[uVar4] = dVar7;
    decoding[uVar4] = 1.0 <= dVar8;
    pmVar3 = H->cols + uVar4;
    dVar8 = 1.0;
    while (pmVar3 = pmVar3->up, -1 < pmVar3->row) {
      dVar7 = pmVar3->pr * dVar8;
      uVar6 = -(ulong)NAN(dVar7);
      pmVar3->pr = (double)(uVar6 & 0x3ff0000000000000 | ~uVar6 & (ulong)dVar7);
      dVar8 = dVar8 * pmVar3->lr;
    }
  }
  return;
}

Assistant:

void bp_update_ps(mod2sparse *H,
    char *synd,
    double *log_prob_ratios,
    int iter,
    char *decoding)
    {
        double pr, dl, t;
        mod2entry *e;
        int N, M;
        int i, j;

        M = mod2sparse_rows(H);
        N = mod2sparse_cols(H);

        /* Recompute likelihood ratios. */

        for (i = 0; i<M; i++)
        {
            if(synd[i]==0) dl = 1;
            if(synd[i]==1) dl=-1;
            for (e = mod2sparse_first_in_row(H,i);
                 !mod2sparse_at_end(e);
                 e = mod2sparse_next_in_row(e))
            { e->lr = dl;
                dl *= 2/(1+e->pr) - 1;
            }
            dl = 1;
            for (e = mod2sparse_last_in_row(H,i);
                 !mod2sparse_at_end(e);
                 e = mod2sparse_prev_in_row(e))
            { t = e->lr * dl;
                e->lr = (1-t)/(1+t);
                dl *= 2/(1+e->pr) - 1;
            }
        }

        /* Recompute probability ratios.  Also find the next guess based on the
           individually most likely values. */

        for (j = 0; j<N; j++)
        { pr = prob_ratio_intial;
            for (e = mod2sparse_first_in_col(H,j);
                 !mod2sparse_at_end(e);
                 e = mod2sparse_next_in_col(e))
            { e->pr = pr;
                pr *= e->lr;
            }
            if (isnan(pr))
            { pr = 1;
            }
            log_prob_ratios[j]=log(1/pr);
            // if (bprb) bprb[j] = 1 - 1/(1+pr);
            decoding[j] = pr>=1;
            pr = 1;
            for (e = mod2sparse_last_in_col(H,j);
                 !mod2sparse_at_end(e);
                 e = mod2sparse_prev_in_col(e))
            { e->pr *= pr;
                if (isnan(e->pr))
                { e->pr = 1;
                }
                pr *= e->lr;
            }
        }

}